

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::RedirectedStream::RedirectedStream
          (RedirectedStream *this,ostream *originalStream,ostream *redirectionStream)

{
  this->m_originalStream = originalStream;
  this->m_redirectionStream = redirectionStream;
  this->m_prevBuf =
       *(streambuf **)(originalStream + *(long *)(*(long *)originalStream + -0x18) + 0xe8);
  std::ios::rdbuf((streambuf *)(originalStream + *(long *)(*(long *)originalStream + -0x18)));
  return;
}

Assistant:

RedirectedStream::RedirectedStream( std::ostream& originalStream, std::ostream& redirectionStream )
    :   m_originalStream( originalStream ),
        m_redirectionStream( redirectionStream ),
        m_prevBuf( m_originalStream.rdbuf() )
    {
        m_originalStream.rdbuf( m_redirectionStream.rdbuf() );
    }